

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

int socketSet(char *where,mpt_fdmode *mode,_func_int_varargs *operation)

{
  int iVar1;
  int *piVar2;
  char *local_108;
  char local_f9;
  char *pcStack_f8;
  char save;
  char *end;
  char *port;
  addrinfo *curr;
  addrinfo *res;
  addrinfo hints;
  size_t len_1;
  sockaddr_un addr;
  int sock;
  int len;
  _func_int_varargs *operation_local;
  mpt_fdmode *mode_local;
  char *where_local;
  
  if (mode->family == '\x01') {
    hints.ai_next = (addrinfo *)strlen(where);
    if ((addrinfo *)0x6b < hints.ai_next) {
      piVar2 = __errno_location();
      *piVar2 = 0x22;
      return -2;
    }
    addr.sun_path._100_4_ = socket(1,(uint)(mode->param).sock.type,(uint)(mode->param).sock.proto);
    if ((int)addr.sun_path._100_4_ < 0) {
      return addr.sun_path._100_4_;
    }
    len_1._2_2_ = 1;
    memcpy((void *)((long)&len_1 + 4),where,(size_t)((long)&(hints.ai_next)->ai_flags + 1));
    iVar1 = (*operation)((ulong)(uint)addr.sun_path._100_4_,(long)&len_1 + 2,0x6e);
    if (iVar1 < 0) {
      close(addr.sun_path._100_4_);
      return -1;
    }
    mode->stream = 3;
    if ((mode->param).sock.type == '\x01') {
      mode->stream = mode->stream | 4;
    }
  }
  else {
    if (((mode->family != '\x02') && (mode->family != '\n')) && (mode->family != '\0')) {
      piVar2 = __errno_location();
      *piVar2 = 0x5d;
      return -4;
    }
    local_f9 = '\0';
    if ((mode->family == '\x02') || (*where != '[')) {
      pcStack_f8 = strrchr(where,0x3a);
      end = pcStack_f8;
      mode_local = (mpt_fdmode *)where;
      if (pcStack_f8 != (char *)0x0) {
        local_f9 = *pcStack_f8;
        end = pcStack_f8 + 1;
        *pcStack_f8 = '\0';
      }
    }
    else {
      mode_local = (mpt_fdmode *)(where + 1);
      pcStack_f8 = strchr((char *)mode_local,0x5d);
      if (pcStack_f8 == (char *)0x0) {
        piVar2 = __errno_location();
        *piVar2 = 0x5f;
        return -2;
      }
      local_f9 = *pcStack_f8;
      *pcStack_f8 = '\0';
      if (pcStack_f8[1] == ':') {
        local_108 = pcStack_f8 + 2;
      }
      else {
        local_108 = (char *)0x0;
      }
      end = local_108;
    }
    memset(&res,0,0x30);
    res._4_4_ = (int)mode->family;
    hints.ai_flags = (int)(mode->param).sock.type;
    hints.ai_family = (int)(mode->param).sock.proto;
    if (mode_local->family == '\0') {
      mode_local = (mpt_fdmode *)0x0;
    }
    iVar1 = getaddrinfo(&mode_local->family,end,(addrinfo *)&res,(addrinfo **)&curr);
    if ((pcStack_f8 != (char *)0x0) && (local_f9 != '\0')) {
      *pcStack_f8 = local_f9;
    }
    if (iVar1 == -0xb) {
      return -1;
    }
    if (iVar1 == -3) {
      return -2;
    }
    if (iVar1 != 0) {
      return -3;
    }
    port = (char *)curr;
    addr.sun_path[0x68] = '\0';
    addr.sun_path[0x69] = '\0';
    addr.sun_path[0x6a] = '\0';
    addr.sun_path[0x6b] = '\0';
    while (addr.sun_path[100] = -1, addr.sun_path[0x65] = -1, addr.sun_path[0x66] = -1,
          addr.sun_path[0x67] = -1, port != (char *)0x0) {
      mode->family = (int8_t)*(undefined4 *)(port + 4);
      (mode->param).sock.type = (uint8_t)*(undefined4 *)(port + 8);
      (mode->param).sock.proto = (uint8_t)*(undefined4 *)(port + 0xc);
      addr.sun_path._100_4_ =
           socket((int)mode->family,(uint)(mode->param).sock.type,(uint)(mode->param).sock.proto);
      if (((int)addr.sun_path._100_4_ < 0) ||
         (iVar1 = (*operation)((ulong)(uint)addr.sun_path._100_4_,*(undefined8 *)(port + 0x18),
                               (ulong)*(uint *)(port + 0x10)), -1 < iVar1)) break;
      port = *(char **)(port + 0x28);
      piVar2 = __errno_location();
      *piVar2 = 0x5c;
      close(addr.sun_path._100_4_);
    }
    if (curr != (addrinfo *)0x0) {
      freeaddrinfo((addrinfo *)curr);
    }
    mode->stream = 3;
    if ((mode->param).sock.type == '\x01') {
      mode->stream = mode->stream | 4;
    }
  }
  iVar1._0_1_ = addr.sun_path[100];
  iVar1._1_1_ = addr.sun_path[0x65];
  iVar1._2_1_ = addr.sun_path[0x66];
  iVar1._3_1_ = addr.sun_path[0x67];
  return iVar1;
}

Assistant:

static int socketSet(const char *where, MPT_STRUCT(fdmode) *mode, int (*operation)())
{
	int len, sock;
	
	/* unix socket */
	if (mode->family == AF_UNIX) {
		struct sockaddr_un addr;
		size_t len;
		
		if ((len = strlen(where)) >= sizeof(addr.sun_path)) {
			errno = ERANGE;
			return -2;
		}
		if ((sock = socket(AF_UNIX, mode->param.sock.type, mode->param.sock.proto)) < 0) {
			return sock;
		}
		addr.sun_family = AF_UNIX;
		memcpy(addr.sun_path, where, len+1);
		if (operation(sock, (struct sockaddr *) &addr, sizeof(addr)) < 0) {
			(void) close(sock);
			return -1;
		}
		mode->stream = MPT_SOCKETFLAG(Read) | MPT_SOCKETFLAG(Write);
		
		if (mode->param.sock.type == SOCK_STREAM) {
			mode->stream |= MPT_SOCKETFLAG(Stream);
		}
	}
	/* ip socket */
	else if (mode->family == AF_INET || mode->family == AF_INET6 || mode->family == AF_UNSPEC) {
		struct addrinfo hints, *res, *curr;
		char *port, *end, save = 0;
		
		if (mode->family != AF_INET && *where == '[') {
			if (!(end = strchr(++where, ']'))) {
				errno = ENOTSUP;
				return -2;
			}
			save = *end;
			*end = 0;
			port = (end[1] == ':') ? end+2 : 0;
		}
		else if ((end = port = strrchr(where, ':'))) {
			save = *end;
			*port++ = 0;
		}
		memset(&hints, 0, sizeof(hints));
		hints.ai_family   = mode->family;
		hints.ai_socktype = mode->param.sock.type;
		hints.ai_protocol = mode->param.sock.proto;
		
		if (!*where) {
			where = 0;
		}
		len = getaddrinfo(where, port, &hints, &res);
		
		if (end && save) {
			*end = save;
		}
		switch (len) {
		  case 0: break;
		  case EAI_AGAIN: return -2;
		  case EAI_SYSTEM: return -1;
		  default: return -3;
		}
		curr = res;
		sock = -1;
		
		while (curr) {
			mode->family           = curr->ai_family;
			mode->param.sock.type  = curr->ai_socktype;
			mode->param.sock.proto = curr->ai_protocol;
			
			if ((sock = socket(mode->family, mode->param.sock.type, mode->param.sock.proto)) < 0) {
				break;
			}
			if (operation(sock, curr->ai_addr, curr->ai_addrlen) >= 0) {
				break;
			}
			curr = curr->ai_next;
			
			errno = ENOPROTOOPT;
			(void) close(sock);
			sock = -1;
		}
		if (res) {
			freeaddrinfo(res);
		}
		mode->stream = MPT_SOCKETFLAG(Read) | MPT_SOCKETFLAG(Write);
		
		if (mode->param.sock.type == SOCK_STREAM) {
			mode->stream |= MPT_SOCKETFLAG(Stream);
		}
	}
	else {
		errno = EPROTONOSUPPORT;
		return -4;
	}
	return sock;
}